

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_bool32 drwav_init(drwav *pWav,drwav_read_proc onRead,drwav_seek_proc onSeek,void *pUserData)

{
  ushort uVar1;
  drwav_bool32 dVar2;
  size_t sVar3;
  long lVar4;
  drwav_uint64 dVar5;
  int iVar6;
  ulong unaff_R13;
  ulong uVar7;
  uchar riff [4];
  uchar chunkSize [8];
  drwav_uint64 sampleCountFromFactChunk;
  drwav_uint32 sampleCount;
  drwav_fmt fmt;
  char local_aa;
  char local_a9;
  char local_a8;
  char local_a7;
  ushort local_a6;
  drwav_uint16 local_a4;
  drwav_uint16 local_a2;
  anon_union_16_2_e4b212a4_for_id local_a0;
  ulong local_90;
  uint local_88;
  drwav_uint64 *local_80;
  ulong local_78;
  drwav_uint32 local_70;
  uint local_6c;
  drwav_fmt local_68;
  ulong local_40;
  ulong local_38;
  
  if (onSeek == (drwav_seek_proc)0x0 || onRead == (drwav_read_proc)0x0) {
    return 0;
  }
  memset(pWav,0,0x150);
  sVar3 = (*onRead)(pUserData,&local_aa,4);
  if (sVar3 != 4) {
    return 0;
  }
  if ((((local_aa == 'R') && (local_a9 == 'I')) && (local_a8 == 'F')) && (local_a7 == 'F')) {
    pWav->container = drwav_container_riff;
  }
  else {
    if (local_aa != 'r') {
      return 0;
    }
    if (local_a9 != 'i') {
      return 0;
    }
    if (local_a8 != 'f') {
      return 0;
    }
    if (local_a7 != 'f') {
      return 0;
    }
    pWav->container = drwav_container_w64;
    sVar3 = (*onRead)(pUserData,&local_68,0xc);
    if (sVar3 != 0xc) {
      return 0;
    }
    lVar4 = 0;
    do {
      if (local_68.subFormat[lVar4 + -0x18] != drwavGUID_W64_RIFF[lVar4 + 4]) {
        return 0;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0xc);
  }
  if (pWav->container == drwav_container_riff) {
    sVar3 = (*onRead)(pUserData,&local_68,4);
    if (sVar3 != 4) {
      return 0;
    }
    if (CONCAT22(local_68.channels,local_68.formatTag) < 0x24) {
      return 0;
    }
    sVar3 = (*onRead)(pUserData,&local_a0,4);
    if (sVar3 != 4) {
      return 0;
    }
    if (local_a0.fourcc[0] != 'W') {
      return 0;
    }
    if (local_a0.fourcc[1] != 'A') {
      return 0;
    }
    if (local_a0.fourcc[2] != 'V') {
      return 0;
    }
    if (local_a0.fourcc[3] != 'E') {
      return 0;
    }
    pWav->dataChunkDataPos = 0xc;
  }
  else {
    sVar3 = (*onRead)(pUserData,&local_a0,8);
    if (sVar3 != 8) {
      return 0;
    }
    if (CONCAT44(local_a0._4_4_,
                 CONCAT13(local_a0.fourcc[3],
                          CONCAT12(local_a0.fourcc[2],
                                   CONCAT11(local_a0.fourcc[1],local_a0.fourcc[0])))) < 0x50) {
      return 0;
    }
    sVar3 = (*onRead)(pUserData,&local_68,0x10);
    if (sVar3 != 0x10) {
      return 0;
    }
    if (CONCAT22(local_68.channels,local_68.formatTag) != 0x65766177) {
      return 0;
    }
    if (local_68.sampleRate != 0x11d3acf3) {
      return 0;
    }
    if (local_68.avgBytesPerSec != 0xc000d18c) {
      return 0;
    }
    if (CONCAT22(local_68.bitsPerSample,local_68.blockAlign) != -0x752471b1) {
      return 0;
    }
    pWav->dataChunkDataPos = 0x28;
  }
  local_80 = &pWav->dataChunkDataPos;
  dVar2 = drwav__read_fmt(onRead,onSeek,pUserData,pWav->container,local_80,&local_68);
  if (dVar2 == 0) {
    return 0;
  }
  if ((local_68.blockAlign == 0 || local_68.bitsPerSample == 0) ||
      (local_68.channels == 0 || local_68.sampleRate == 0)) {
    return 0;
  }
  local_a2 = local_68.bitsPerSample;
  local_70 = local_68.sampleRate;
  local_a6 = local_68.channels;
  local_38 = (ulong)local_68.channels;
  local_40 = (ulong)local_68.blockAlign;
  local_a4 = local_68.formatTag;
  if (local_68.formatTag == 0xfffe) {
    local_a4._0_1_ = local_68.subFormat[0];
    local_a4._1_1_ = local_68.subFormat[1];
  }
  local_78 = 0;
  do {
    dVar2 = drwav__read_chunk_header
                      (onRead,pUserData,pWav->container,local_80,(drwav__chunk_header *)&local_a0);
    uVar7 = local_90;
    iVar6 = 1;
    if (dVar2 != 0) {
      unaff_R13 = uVar7;
      if (pWav->container == drwav_container_riff) {
        if (((local_a0.fourcc[0] == 'd') && (local_a0.fourcc[1] == 'a')) &&
           ((local_a0.fourcc[2] == 't' && (local_a0.fourcc[3] == 'a')))) goto LAB_0010a37b;
      }
      else if (((CONCAT13(local_a0.fourcc[3],
                          CONCAT12(local_a0.fourcc[2],
                                   CONCAT11(local_a0.fourcc[1],local_a0.fourcc[0]))) == 0x61746164)
               && (local_a0._4_4_ == 0x11d3acf3)) &&
              ((local_a0._8_4_ == -0x3fff2e74 && (local_a0._12_4_ == -0x752471b1)))) {
LAB_0010a37b:
        iVar6 = 5;
        goto LAB_0010a461;
      }
      if (pWav->container == drwav_container_riff) {
        if ((((local_a0.fourcc[0] == 'f') && (local_a0.fourcc[1] == 'a')) &&
            (local_a0.fourcc[2] == 'c')) && (local_a0.fourcc[3] == 't')) {
          sVar3 = (*onRead)(pUserData,&local_6c,4);
          if (sVar3 == 4) {
            pWav->dataChunkDataPos = pWav->dataChunkDataPos + 4;
            uVar7 = uVar7 - 4;
            local_78 = (ulong)local_6c;
            if (pWav->translatedFormatTag != 2) {
              local_78 = 0;
            }
          }
          unaff_R13 = uVar7;
          if (sVar3 != 4) goto LAB_0010a461;
        }
      }
      else if (((CONCAT13(local_a0.fourcc[3],
                          CONCAT12(local_a0.fourcc[2],
                                   CONCAT11(local_a0.fourcc[1],local_a0.fourcc[0]))) == 0x74636166)
               && (local_a0._4_4_ == 0x11d3acf3)) &&
              ((local_a0._8_4_ == -0x3fff2e74 && (local_a0._12_4_ == -0x752471b1)))) {
        sVar3 = (*onRead)(pUserData,&local_78,8);
        if (sVar3 != 8) goto LAB_0010a461;
        *local_80 = *local_80 + 4;
        uVar7 = uVar7 - 8;
      }
      unaff_R13 = uVar7 + local_88;
      drwav__seek_forward(onSeek,unaff_R13,pUserData);
      *local_80 = *local_80 + unaff_R13;
      iVar6 = 0;
    }
LAB_0010a461:
    if (iVar6 != 0) {
      if (iVar6 != 5) {
        return 0;
      }
      pWav->onRead = onRead;
      pWav->onSeek = onSeek;
      pWav->pUserData = pUserData;
      (pWav->fmt).formatTag = local_68.formatTag;
      (pWav->fmt).channels = local_68.channels;
      (pWav->fmt).sampleRate = local_68.sampleRate;
      (pWav->fmt).avgBytesPerSec = local_68.avgBytesPerSec;
      (pWav->fmt).blockAlign = local_68.blockAlign;
      (pWav->fmt).bitsPerSample = local_68.bitsPerSample;
      (pWav->fmt).extendedSize = local_68.extendedSize;
      (pWav->fmt).validBitsPerSample = local_68.validBitsPerSample;
      (pWav->fmt).channelMask = local_68.channelMask;
      *(ulong *)(pWav->fmt).subFormat = CONCAT62(local_68.subFormat._2_6_,local_68.subFormat._0_2_);
      *(undefined8 *)((pWav->fmt).subFormat + 8) = local_68.subFormat._8_8_;
      pWav->sampleRate = local_70;
      pWav->channels = (ushort)local_38;
      pWav->bitsPerSample = local_a2;
      uVar1 = (ushort)local_40 / (ushort)local_38;
      pWav->bytesPerSample = uVar1;
      pWav->bytesRemaining = unaff_R13;
      pWav->translatedFormatTag = local_a4;
      pWav->dataChunkDataSize = unaff_R13;
      if ((ushort)local_40 < local_a6) {
        return 0;
      }
      if (local_78 == 0) {
        pWav->totalSampleCount = unaff_R13 / uVar1;
        if (local_a4 == 0x11) {
          dVar5 = (local_38 + (long)((int)local_40 + (int)local_38 * -4) * 2) *
                  (unaff_R13 / local_40);
        }
        else {
          if (local_a4 != 2) {
            return 1;
          }
          dVar5 = (local_38 * 0x7ffffffffffffffa + local_40) * (unaff_R13 / local_40) * 2;
        }
      }
      else {
        dVar5 = local_78 * local_38;
      }
      pWav->totalSampleCount = dVar5;
      if (((local_a4 == 0x11) || (local_a4 == 2)) &&
         (((pWav->bytesPerSample = 0, local_a4 == 0x11 || (local_a4 == 2)) && (2 < local_a6)))) {
        return 0;
      }
      return 1;
    }
  } while( true );
}

Assistant:

drwav_bool32 drwav_init(drwav* pWav, drwav_read_proc onRead, drwav_seek_proc onSeek, void* pUserData) {
    if (onRead == NULL || onSeek == NULL) {
        return DRWAV_FALSE;
    }

    drwav_zero_memory(pWav, sizeof(*pWav));


    // The first 4 bytes should be the RIFF identifier.
    unsigned char riff[4];
    if (onRead(pUserData, riff, sizeof(riff)) != sizeof(riff)) {
        return DRWAV_FALSE;  // Failed to read data.
    }

    // The first 4 bytes can be used to identify the container. For RIFF files it will start with "RIFF" and for
    // w64 it will start with "riff".
    if (drwav__fourcc_equal(riff, "RIFF")) {
        pWav->container = drwav_container_riff;
    } else if (drwav__fourcc_equal(riff, "riff")) {
        pWav->container = drwav_container_w64;

        // Check the rest of the GUID for validity.
        drwav_uint8 riff2[12];
        if (onRead(pUserData, riff2, sizeof(riff2)) != sizeof(riff2)) {
            return DRWAV_FALSE;
        }

        for (int i = 0; i < 12; ++i) {
            if (riff2[i] != drwavGUID_W64_RIFF[i + 4]) {
                return DRWAV_FALSE;
            }
        }
    } else {
        return DRWAV_FALSE;  // Unknown or unsupported container.
    }


    if (pWav->container == drwav_container_riff) {
        // RIFF/WAVE
        unsigned char chunkSizeBytes[4];
        if (onRead(pUserData, chunkSizeBytes, sizeof(chunkSizeBytes)) != sizeof(chunkSizeBytes)) {
            return DRWAV_FALSE;
        }

        unsigned int chunkSize = drwav__bytes_to_u32(chunkSizeBytes);
        if (chunkSize < 36) {
            return DRWAV_FALSE;  // Chunk size should always be at least 36 bytes.
        }

        unsigned char wave[4];
        if (onRead(pUserData, wave, sizeof(wave)) != sizeof(wave)) {
            return DRWAV_FALSE;
        }

        if (!drwav__fourcc_equal(wave, "WAVE")) {
            return DRWAV_FALSE;  // Expecting "WAVE".
        }

        pWav->dataChunkDataPos = 4 + sizeof(chunkSizeBytes) + sizeof(wave);
    } else {
        // W64
        unsigned char chunkSize[8];
        if (onRead(pUserData, chunkSize, sizeof(chunkSize)) != sizeof(chunkSize)) {
            return DRWAV_FALSE;
        }

        if (drwav__bytes_to_u64(chunkSize) < 80) {
            return DRWAV_FALSE;
        }

        drwav_uint8 wave[16];
        if (onRead(pUserData, wave, sizeof(wave)) != sizeof(wave)) {
            return DRWAV_FALSE;
        }

        if (!drwav__guid_equal(wave, drwavGUID_W64_WAVE)) {
            return DRWAV_FALSE;
        }

        pWav->dataChunkDataPos = 16 + sizeof(chunkSize) + sizeof(wave);
    }


    // The next 24 bytes should be the "fmt " chunk.
    drwav_fmt fmt;
    if (!drwav__read_fmt(onRead, onSeek, pUserData, pWav->container, &pWav->dataChunkDataPos, &fmt)) {
        return DRWAV_FALSE;  // Failed to read the "fmt " chunk.
    }

    // Basic validation.
    if (fmt.sampleRate == 0 || fmt.channels == 0 || fmt.bitsPerSample == 0 || fmt.blockAlign == 0) {
        return DRWAV_FALSE;  // Invalid channel count. Probably an invalid WAV file.
    }


    // Translate the internal format.
    unsigned short translatedFormatTag = fmt.formatTag;
    if (translatedFormatTag == DR_WAVE_FORMAT_EXTENSIBLE) {
        translatedFormatTag = drwav__bytes_to_u16(fmt.subFormat + 0);
    }


    drwav_uint64 sampleCountFromFactChunk = 0;

    // The next chunk we care about is the "data" chunk. This is not necessarily the next chunk so we'll need to loop.
    drwav_uint64 dataSize;
    for (;;) {
        drwav__chunk_header header;
        if (!drwav__read_chunk_header(onRead, pUserData, pWav->container, &pWav->dataChunkDataPos, &header)) {
            return DRWAV_FALSE;
        }

        dataSize = header.sizeInBytes;
        if (pWav->container == drwav_container_riff) {
            if (drwav__fourcc_equal(header.id.fourcc, "data")) {
                break;
            }
        } else {
            if (drwav__guid_equal(header.id.guid, drwavGUID_W64_DATA)) {
                break;
            }
        }

        // Optional. Get the total sample count from the FACT chunk. This is useful for compressed formats.
        if (pWav->container == drwav_container_riff) {
            if (drwav__fourcc_equal(header.id.fourcc, "fact")) {
                drwav_uint32 sampleCount;
                if (onRead(pUserData, &sampleCount, 4) != 4) {
                    return DRWAV_FALSE;
                }
                pWav->dataChunkDataPos += 4;
                dataSize -= 4;

                // The sample count in the "fact" chunk is either unreliable, or I'm not understanding it properly. For
                // now I am only enabling this for Microsoft ADPCM formats.
                if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
                    sampleCountFromFactChunk = sampleCount;
                } else {
                    sampleCountFromFactChunk = 0;
                }
            }
        } else {
            if (drwav__guid_equal(header.id.guid, drwavGUID_W64_FACT)) {
                if (onRead(pUserData, &sampleCountFromFactChunk, 8) != 8) {
                    return DRWAV_FALSE;
                }
                pWav->dataChunkDataPos += 4;
                dataSize -= 8;
            }
        }

        // If we get here it means we didn't find the "data" chunk. Seek past it.

        // Make sure we seek past the padding.
        dataSize += header.paddingSize;
        drwav__seek_forward(onSeek, dataSize, pUserData);
        pWav->dataChunkDataPos += dataSize;
    }

    // At this point we should be sitting on the first byte of the raw audio data.

    pWav->onRead = onRead;
    pWav->onSeek = onSeek;
    pWav->pUserData = pUserData;
    pWav->fmt = fmt;
    pWav->sampleRate = fmt.sampleRate;
    pWav->channels = fmt.channels;
    pWav->bitsPerSample = fmt.bitsPerSample;
    pWav->bytesPerSample = fmt.blockAlign / fmt.channels;
    pWav->bytesRemaining = dataSize;
    pWav->translatedFormatTag = translatedFormatTag;
    pWav->dataChunkDataSize = dataSize;

    // The bytes per sample should never be 0 at this point. This would indicate an invalid WAV file.
    if (pWav->bytesPerSample == 0) {
        return DRWAV_FALSE;
    }

    if (sampleCountFromFactChunk != 0) {
        pWav->totalSampleCount = sampleCountFromFactChunk * fmt.channels;
    } else {
        pWav->totalSampleCount = dataSize / pWav->bytesPerSample;

        if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
            drwav_uint64 blockCount = dataSize / fmt.blockAlign;
            pWav->totalSampleCount =
                (blockCount * (fmt.blockAlign - (6 * pWav->channels))) * 2;  // x2 because two samples per byte.
        }
        if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
            drwav_uint64 blockCount = dataSize / fmt.blockAlign;
            pWav->totalSampleCount =
                ((blockCount * (fmt.blockAlign - (4 * pWav->channels))) * 2) + (blockCount * pWav->channels);
        }
    }

    // The way we calculate the bytes per sample does not make sense for compressed formats so we just set it to 0.
    if (drwav__is_compressed_format_tag(pWav->translatedFormatTag)) {
        pWav->bytesPerSample = 0;
    }

    // Some formats only support a certain number of channels.
    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM || pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
        if (pWav->channels > 2) {
            return DRWAV_FALSE;
        }
    }

#ifdef DR_WAV_LIBSNDFILE_COMPAT
    // I use libsndfile as a benchmark for testing, however in the version I'm using (from the Windows installer on the
    // libsndfile website), it appears the total sample count libsndfile uses for MS-ADPCM is incorrect. It would seem
    // they are computing the total sample count from the number of blocks, however this results in the inclusion of the
    // extra silent samples at the end of the last block. The correct way to know the total sample count is to inspect
    // the "fact" chunk which should always be present for compressed formats, and should always include the sample
    // count. This little block of code below is only used to emulate the libsndfile logic so I can properly run my
    // correctness tests against libsndfile, and is disabled by default.
    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
        drwav_uint64 blockCount = dataSize / fmt.blockAlign;
        pWav->totalSampleCount =
            (blockCount * (fmt.blockAlign - (6 * pWav->channels))) * 2;  // x2 because two samples per byte.
    }
    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
        drwav_uint64 blockCount = dataSize / fmt.blockAlign;
        pWav->totalSampleCount =
            ((blockCount * (fmt.blockAlign - (4 * pWav->channels))) * 2) + (blockCount * pWav->channels);
    }
#endif

    return DRWAV_TRUE;
}